

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_expr.hh
# Opt level: O0

void def_attributes<pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>,kratos::Var>
               (class_<kratos::Var,_std::shared_ptr<kratos::Var>_> *class_)

{
  class_<kratos::Var,std::shared_ptr<kratos::Var>> *pcVar1;
  type local_62;
  return_value_policy local_61;
  code *local_60;
  undefined8 local_58;
  code *local_50;
  undefined8 local_48;
  return_value_policy local_39;
  code *local_38;
  undefined8 local_30;
  type local_21;
  code *local_20;
  undefined8 local_18;
  class_<kratos::Var,_std::shared_ptr<kratos::Var>_> *local_10;
  class_<kratos::Var,_std::shared_ptr<kratos::Var>_> *class__local;
  
  local_20 = kratos::IRNode::add_attribute;
  local_18 = 0;
  local_10 = class_;
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def<void(kratos::IRNode::*)(std::shared_ptr<kratos::Attribute>const&)>
                     ((class_<kratos::Var,std::shared_ptr<kratos::Var>> *)class_,"add_attribute",
                      (offset_in_IRNode_to_subr *)&local_20);
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def<def_attributes<pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>,kratos::Var>(pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>&)::_lambda(kratos::Var&,std::__cxx11::string_const&)_1_>
                     (pcVar1,"add_attribute",&local_21);
  local_38 = kratos::IRNode::get_attributes;
  local_30 = 0;
  local_39 = reference;
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def<std::vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>const&(kratos::IRNode::*)()const,pybind11::return_value_policy>
                     (pcVar1,"get_attributes",(offset_in_IRNode_to_subr *)&local_38,&local_39);
  local_50 = kratos::IRNode::has_attribute;
  local_48 = 0;
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def<bool(kratos::IRNode::*)(std::__cxx11::string_const&)const>
                     (pcVar1,"has_attribute",(offset_in_IRNode_to_subr *)&local_50);
  local_60 = kratos::IRNode::get_attributes;
  local_58 = 0;
  local_61 = reference;
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def_property_readonly<std::vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>const&(kratos::IRNode::*)()const,pybind11::return_value_policy>
                     (pcVar1,"attributes",(offset_in_IRNode_to_subr *)&local_60,&local_61);
  pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
  def<def_attributes<pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>,kratos::Var>(pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>&)::_lambda(kratos::Var&,std::function<bool(std::shared_ptr<kratos::Attribute>)>const&)_1_>
            (pcVar1,"find_attribute",&local_62);
  return;
}

Assistant:

void def_attributes(T &class_) {
    namespace py = pybind11;
    class_.def("add_attribute", &K::add_attribute)
        .def("add_attribute",
             [](K &obj, const std::string &value) {
                 auto attr = std::make_shared<kratos::Attribute>();
                 attr->type_str = "Python";
                 attr->value_str = value;
                 obj.add_attribute(attr);
             })
        .def("get_attributes", &K::get_attributes, py::return_value_policy::reference)
        .def("has_attribute", &K::has_attribute)
        .def_property_readonly("attributes", &K::get_attributes, py::return_value_policy::reference)
        .def("find_attribute",
             [](K &node, const std::function<bool(std::shared_ptr<kratos::Attribute>)> &func) {
                 auto const &attributes = node.get_attributes();
                 std::vector<std::shared_ptr<kratos::Attribute>> result;
                 for (auto const &attr : attributes) {
                     if (func(attr)) result.emplace_back(attr);
                 }
                 return result;
             });
}